

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_true,_true>::enumerate_prefix
          (DaTrie<false,_true,_true> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  pointer pcVar3;
  uint uVar4;
  uint node_pos_00;
  __string_type __str;
  KvPair local_58;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  node_pos_00 = SUB84(pBVar2[node_pos],0);
  if ((int)node_pos_00 < 0) {
    uVar4 = node_pos_00 & 0x7fffffff;
    if ((node_pos != 0) &&
       (((uint)*(undefined8 *)(&pBVar2->field_0x0 + ((ulong)pBVar2[node_pos] >> 0x1d & 0x3fffffff8))
        & 0x7fffffff) == node_pos)) {
      uVar4 = node_pos_00;
    }
    paVar1 = &local_58.key.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_58.key._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + prefix->_M_string_length);
    local_58.value = uVar4;
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::emplace_back<ddd::KvPair>(kvs,&local_58)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.key._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.key._M_dataplus._M_p);
    }
  }
  else {
    if ((*(uint *)&pBVar2[node_pos_00 & 0x7fffffff].field_0x4 & 0x7fffffff) == node_pos) {
      enumerate_prefix(this,node_pos_00,prefix,kvs);
    }
    uVar4 = 1;
    do {
      if ((*(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4 ^ node_pos_00].field_0x4 & 0x7fffffff)
          == node_pos) {
        local_58.key._M_dataplus._M_p = (pointer)&local_58.key.field_2;
        pcVar3 = (prefix->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar3,pcVar3 + prefix->_M_string_length);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&local_58,local_58.key._M_string_length,0,'\x01');
        enumerate_prefix(this,uVar4 ^ node_pos_00,&local_58.key,kvs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.key._M_dataplus._M_p != &local_58.key.field_2) {
          operator_delete(local_58.key._M_dataplus._M_p);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x100);
  }
  return;
}

Assistant:

void enumerate_prefix(uint32_t node_pos, const std::string& prefix,
                        std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(Prefix);

    if (bc_[node_pos].is_leaf()) {
      auto value = bc_[node_pos].value();
      if (is_terminal_(node_pos)) {
        value |= (1U << 31);
      }
      kvs.push_back(KvPair{prefix, value});
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate_prefix(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate_prefix(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }